

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_7b5804::Helper::GetDestinationForType
          (string *__return_storage_ptr__,Helper *this,cmInstallCommandArguments *args,string *type)

{
  bool bVar1;
  string *psVar2;
  cmInstallCommandArguments *args_00;
  cmInstallCommandArguments *args_01;
  cmInstallCommandArguments *args_02;
  cmInstallCommandArguments *args_03;
  cmInstallCommandArguments *args_04;
  cmInstallCommandArguments *args_05;
  cmInstallCommandArguments *args_06;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  if ((args != (cmInstallCommandArguments *)0x0) &&
     (psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args),
     psVar2->_M_string_length != 0)) {
    psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    return __return_storage_ptr__;
  }
  bVar1 = std::operator==(type,"BIN");
  if (bVar1) {
    (anonymous_namespace)::Helper::GetRuntimeDestination_abi_cxx11_
              (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
    return __return_storage_ptr__;
  }
  bVar1 = std::operator==(type,"SBIN");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CMAKE_INSTALL_SBINDIR",(allocator<char> *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"sbin",&local_81);
    GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_80,&local_60)
    ;
  }
  else {
    bVar1 = std::operator==(type,"SYSCONF");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"CMAKE_INSTALL_SYSCONFDIR",(allocator<char> *)&local_40);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"etc",&local_81);
      GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_80,
                     &local_60);
    }
    else {
      bVar1 = std::operator==(type,"SHAREDSTATE");
      if (!bVar1) {
        bVar1 = std::operator==(type,"LOCALSTATE");
        if (bVar1) {
          (anonymous_namespace)::Helper::GetLocalStateDestination_abi_cxx11_
                    (__return_storage_ptr__,this,args_00);
          return __return_storage_ptr__;
        }
        bVar1 = std::operator==(type,"RUNSTATE");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"CMAKE_INSTALL_RUNSTATEDIR",&local_81);
          (anonymous_namespace)::Helper::GetLocalStateDestination_abi_cxx11_(&local_40,this,args_01)
          ;
          std::operator+(&local_60,&local_40,"/run");
          GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_80,
                         &local_60);
        }
        else {
          bVar1 = std::operator==(type,"LIB");
          if (bVar1) {
            (anonymous_namespace)::Helper::GetLibraryDestination_abi_cxx11_
                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
            return __return_storage_ptr__;
          }
          bVar1 = std::operator==(type,"INCLUDE");
          if (bVar1) {
            (anonymous_namespace)::Helper::GetIncludeDestination_abi_cxx11_
                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
            return __return_storage_ptr__;
          }
          bVar1 = std::operator==(type,"DATA");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"CMAKE_INSTALL_DATADIR",(allocator<char> *)&local_40);
            (anonymous_namespace)::Helper::GetDataRootDestination_abi_cxx11_(&local_60,this,args_02)
            ;
            GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_80,
                           &local_60);
            goto LAB_00250395;
          }
          bVar1 = std::operator==(type,"INFO");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"CMAKE_INSTALL_INFODIR",&local_81);
            (anonymous_namespace)::Helper::GetDataRootDestination_abi_cxx11_(&local_40,this,args_03)
            ;
            std::operator+(&local_60,&local_40,"/info");
            GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_80,
                           &local_60);
          }
          else {
            bVar1 = std::operator==(type,"LOCALE");
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_80,"CMAKE_INSTALL_LOCALEDIR",&local_81);
              (anonymous_namespace)::Helper::GetDataRootDestination_abi_cxx11_
                        (&local_40,this,args_04);
              std::operator+(&local_60,&local_40,"/locale");
              GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_80,
                             &local_60);
            }
            else {
              bVar1 = std::operator==(type,"MAN");
              if (bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_80,"CMAKE_INSTALL_MANDIR",&local_81);
                (anonymous_namespace)::Helper::GetDataRootDestination_abi_cxx11_
                          (&local_40,this,args_05);
                std::operator+(&local_60,&local_40,"/man");
                GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,
                               &local_80,&local_60);
              }
              else {
                bVar1 = std::operator==(type,"DOC");
                if (!bVar1) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_80);
                  return __return_storage_ptr__;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_80,"CMAKE_INSTALL_DOCDIR",&local_81);
                (anonymous_namespace)::Helper::GetDataRootDestination_abi_cxx11_
                          (&local_40,this,args_06);
                std::operator+(&local_60,&local_40,"/doc");
                GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,
                               &local_80,&local_60);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&local_60);
        psVar2 = &local_40;
        goto LAB_0025039a;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"CMAKE_INSTALL_SHAREDSTATEDIR",(allocator<char> *)&local_40);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"com",&local_81);
      GetDestination(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0,&local_80,
                     &local_60);
    }
  }
LAB_00250395:
  psVar2 = &local_60;
LAB_0025039a:
  std::__cxx11::string::~string((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetDestinationForType(
  const cmInstallCommandArguments* args, const std::string& type) const
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  if (type == "BIN") {
    return this->GetRuntimeDestination(nullptr);
  }
  if (type == "SBIN") {
    return this->GetSbinDestination(nullptr);
  }
  if (type == "SYSCONF") {
    return this->GetSysconfDestination(nullptr);
  }
  if (type == "SHAREDSTATE") {
    return this->GetSharedStateDestination(nullptr);
  }
  if (type == "LOCALSTATE") {
    return this->GetLocalStateDestination(nullptr);
  }
  if (type == "RUNSTATE") {
    return this->GetRunStateDestination(nullptr);
  }
  if (type == "LIB") {
    return this->GetLibraryDestination(nullptr);
  }
  if (type == "INCLUDE") {
    return this->GetIncludeDestination(nullptr);
  }
  if (type == "DATA") {
    return this->GetDataDestination(nullptr);
  }
  if (type == "INFO") {
    return this->GetInfoDestination(nullptr);
  }
  if (type == "LOCALE") {
    return this->GetLocaleDestination(nullptr);
  }
  if (type == "MAN") {
    return this->GetManDestination(nullptr);
  }
  if (type == "DOC") {
    return this->GetDocDestination(nullptr);
  }
  return "";
}